

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O2

void basisu::compute_block_error
               (color_rgba (*block) [4],color_rgba (*decoded_block) [4],uint64_t *total_rgb_err,
               uint64_t *total_rgba_err,uint64_t *total_la_err)

{
  uint32_t y;
  long lVar1;
  uint64_t uVar2;
  uint32_t x;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar10 [16];
  
  lVar4 = 0;
  lVar5 = 0;
  lVar6 = 0;
  lVar7 = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      auVar8 = pmovzxbd(in_XMM3,(*block)[lVar3].field_0);
      auVar10 = pmovzxbd(in_XMM4,(*decoded_block)[lVar3].field_0);
      auVar9._0_4_ = auVar8._0_4_ - auVar10._0_4_;
      auVar9._4_4_ = auVar8._4_4_ - auVar10._4_4_;
      auVar9._8_4_ = auVar8._8_4_ - auVar10._8_4_;
      auVar9._12_4_ = auVar8._12_4_ - auVar10._12_4_;
      auVar8 = pmulld(auVar9,auVar9);
      in_XMM4 = pmovzxdq(auVar10,auVar8);
      in_XMM3._0_8_ = CONCAT44(0,auVar8._8_4_);
      in_XMM3._8_4_ = auVar8._12_4_;
      in_XMM3._12_4_ = 0;
      lVar6 = lVar6 + in_XMM3._0_8_;
      lVar7 = lVar7 + (ulong)auVar8._12_4_;
      lVar4 = lVar4 + in_XMM4._0_8_;
      lVar5 = lVar5 + in_XMM4._8_8_;
    }
    block = block + 1;
    decoded_block = decoded_block + 1;
  }
  *total_la_err = lVar4 + lVar7;
  uVar2 = lVar6 + lVar4 + lVar5;
  *total_rgb_err = uVar2;
  *total_rgba_err = uVar2 + lVar7;
  return;
}

Assistant:

static void compute_block_error(const color_rgba block[4][4], const color_rgba decoded_block[4][4], uint64_t &total_rgb_err, uint64_t &total_rgba_err, uint64_t &total_la_err)
	{
		uint64_t total_err_r = 0, total_err_g = 0, total_err_b = 0, total_err_a = 0;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				const int dr = (int)block[y][x].m_comps[0] - (int)decoded_block[y][x].m_comps[0];
				const int dg = (int)block[y][x].m_comps[1] - (int)decoded_block[y][x].m_comps[1];
				const int db = (int)block[y][x].m_comps[2] - (int)decoded_block[y][x].m_comps[2];
				const int da = (int)block[y][x].m_comps[3] - (int)decoded_block[y][x].m_comps[3];

				total_err_r += dr * dr;
				total_err_g += dg * dg;
				total_err_b += db * db;
				total_err_a += da * da;
			}
		}

		total_la_err = total_err_r + total_err_a;
		total_rgb_err = total_err_r + total_err_g + total_err_b;
		total_rgba_err = total_rgb_err + total_err_a;
	}